

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O2

void Js::JavascriptArray::Unshift<unsigned_int,unsigned_int>
               (RecyclableObject *obj,uint *toIndex,uint start,uint end,ScriptContext *scriptContext
               )

{
  BOOL BVar1;
  Var newValue;
  undefined1 local_70 [8];
  ThrowTypeErrorOnFailureHelper h;
  undefined1 local_58 [8];
  JsReentLock jsReentLock;
  
  local_58 = (undefined1  [8])scriptContext->threadContext;
  jsReentLock.m_threadContext = (ThreadContext *)0x0;
  jsReentLock.m_arrayObject = (Var)0x0;
  jsReentLock.m_arrayObject2._0_1_ = ((ThreadContext *)local_58)->noJsReentrancy;
  ((ThreadContext *)local_58)->noJsReentrancy = true;
  h.m_functionName = (PCWSTR)toIndex;
  JsReentLock::setObjectForMutation((JsReentLock *)local_58,obj);
  h.m_scriptContext = (ScriptContext *)anon_var_dwarf_6941011;
  if (start < end) {
    jsReentLock._28_4_ = ~start + end + *(int *)h.m_functionName;
    local_70 = (undefined1  [8])scriptContext;
    while (start < end) {
      *(undefined1 *)((long)local_58 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
      end = end - 1;
      BVar1 = JavascriptOperators::HasItem(obj,end);
      JsReentLock::MutateArrayObject((JsReentLock *)local_58);
      *(bool *)((long)local_58 + 0x108) = true;
      *(undefined1 *)((long)local_58 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
      if (BVar1 == 0) {
        BVar1 = JavascriptOperators::DeleteItem
                          (obj,jsReentLock._28_4_,PropertyOperation_ThrowOnDeleteIfNotConfig);
        ThrowTypeErrorOnFailureHelper::ThrowTypeErrorOnFailure
                  ((ThrowTypeErrorOnFailureHelper *)local_70,BVar1);
        JsReentLock::MutateArrayObject((JsReentLock *)local_58);
      }
      else {
        newValue = JavascriptOperators::GetItem(obj,end,scriptContext);
        BVar1 = IndexTrace<unsigned_int>::SetItem
                          (obj,(uint32 *)&jsReentLock.field_0x1c,newValue,
                           PropertyOperation_ThrowIfNotExtensible);
        ThrowTypeErrorOnFailureHelper::ThrowTypeErrorOnFailure
                  ((ThrowTypeErrorOnFailureHelper *)local_70,BVar1);
        JsReentLock::MutateArrayObject((JsReentLock *)local_58);
      }
      *(bool *)((long)local_58 + 0x108) = true;
      jsReentLock._28_4_ = jsReentLock._28_4_ + -1;
    }
  }
  *(undefined1 *)((long)local_58 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
  return;
}

Assistant:

void JavascriptArray::Unshift(RecyclableObject* obj, const T& toIndex, P start, P end, ScriptContext* scriptContext)
    {
        JS_REENTRANCY_LOCK(jsReentLock, scriptContext->GetThreadContext());
        SETOBJECT_FOR_MUTATION(jsReentLock, obj);

        typedef IndexTrace<T> index_trace;

        ThrowTypeErrorOnFailureHelper h(scriptContext, _u("Array.prototype.unshift"));
        if (start < end)
        {
            T newEnd = (end - start - 1);// newEnd - 1
            T dst = toIndex + newEnd;
            for (P i = end; i > start; --i)
            {
                JS_REENTRANT(jsReentLock, BOOL hasItem = JavascriptOperators::HasItem(obj, i - 1));
                if (hasItem)
                {
                    Var element = nullptr;
                    JS_REENTRANT(jsReentLock, element = JavascriptOperators::GetItem(obj, i - 1, scriptContext),
                        h.ThrowTypeErrorOnFailure(index_trace::SetItem(obj, dst, element, PropertyOperation_ThrowIfNotExtensible)));
                }
                else
                {
                    JS_REENTRANT(jsReentLock, h.ThrowTypeErrorOnFailure(index_trace::DeleteItem(obj, dst, PropertyOperation_ThrowOnDeleteIfNotConfig)));
                }

                --dst;
            }
        }
    }